

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBMX055.cpp
# Opt level: O0

bool __thiscall RTIMUBMX055::setGyroFSR(RTIMUBMX055 *this)

{
  bool bVar1;
  RTIMUBMX055 *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_BMX055GyroFsr) {
  case 0:
    this->m_gyroScale = 0.0010646508;
    break;
  case 1:
    this->m_gyroScale = 0.0005323254;
    break;
  case 2:
    this->m_gyroScale = 0.0002670354;
    break;
  case 3:
    this->m_gyroScale = 0.00013264503;
    break;
  case 4:
    this->m_gyroScale = 6.6322515e-05;
    break;
  default:
    fprintf(_stderr,"Illegal BMX055 gyro FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_BMX055GyroFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'\x0f',(uchar)((this->super_RTIMU).m_settings)->m_BMX055GyroFsr,
                             "Failed to set BMX055 gyro rate");
  return bVar1;
}

Assistant:

bool RTIMUBMX055::setGyroFSR()
{
    switch(m_settings->m_BMX055GyroFsr) {
    case BMX055_GYRO_FSR_2000:
        m_gyroScale = 0.061 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_1000:
        m_gyroScale = 0.0305 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_500:
        m_gyroScale = 0.0153 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_250:
        m_gyroScale = 0.0076 * RTMATH_DEGREE_TO_RAD;
        break;

    case BMX055_GYRO_FSR_125:
        m_gyroScale = 0.0038 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal BMX055 gyro FSR code %d\n", m_settings->m_BMX055GyroFsr);
        return false;

    }
    return (m_settings->HALWrite(m_gyroSlaveAddr, BMX055_GYRO_RANGE, m_settings->m_BMX055GyroFsr, "Failed to set BMX055 gyro rate"));
}